

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:89:30)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:89:30)>
             *this)

{
  MonotonicClock *pMVar1;
  long lVar2;
  DebugComparison<kj::Maybe<kj::Locked<unsigned_int>_>_&,_const_kj::None_&> _kjCondition;
  Quantity<long,_kj::_::NanosecondLabel> duration;
  Quantity<long,_kj::_::NanosecondLabel> timeout;
  Maybe<kj::Locked<unsigned_int>_> maybeLock;
  
  timeout.value = 8000000;
  MutexGuarded<unsigned_int>::lockExclusiveWithTimeout(&maybeLock,(this->f).value,8000000);
  pMVar1 = systemPreciseMonotonicClock();
  lVar2 = (*(code *)**(undefined8 **)pMVar1)(pMVar1);
  duration.value = lVar2 - (((this->f).threadStartTime)->value).value;
  _kjCondition.result = (bool)(maybeLock.ptr.isSet ^ 1);
  _kjCondition.right = (None *)&none;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((maybeLock.ptr.isSet & _::Debug::minSeverity < 3) != 0) {
    _kjCondition.left = &maybeLock;
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::Maybe<kj::Locked<unsigned_int>>&,kj::None_const&>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5e,ERROR,"\"failed: expected \" \"maybeLock == kj::none\", _kjCondition, duration"
               ,(char (*) [39])"failed: expected maybeLock == kj::none",&_kjCondition,&duration);
  }
  _kjCondition.result = 7999999 < duration.value;
  _kjCondition.right = (None *)&timeout;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.left = (Maybe<kj::Locked<unsigned_int>_> *)&duration;
  if ((duration.value < 8000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"duration >= timeout\", _kjCondition",
               (char (*) [37])"failed: expected duration >= timeout",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_&>
                *)&_kjCondition);
  }
  _::NullableValue<kj::Locked<unsigned_int>_>::~NullableValue(&maybeLock.ptr);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }